

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

undefined4 __thiscall
testing::internal::FunctionMockerBase<TestColumnSizeHandler_()>::PerformDefaultAction
          (FunctionMockerBase<TestColumnSizeHandler_()> *this,ArgumentTuple *args,
          string *call_description)

{
  bool bVar1;
  OnCallSpec<TestColumnSizeHandler_()> *pOVar2;
  runtime_error *this_00;
  OnCallSpec<TestColumnSizeHandler_()> *in_RDX;
  Action<TestColumnSizeHandler_()> *in_RSI;
  string message;
  OnCallSpec<TestColumnSizeHandler_()> *spec;
  ArgumentTuple *in_stack_ffffffffffffffb0;
  FunctionMockerBase<TestColumnSizeHandler_()> *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  pOVar2 = FindOnCallSpec(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pOVar2 == (OnCallSpec<TestColumnSizeHandler_()> *)0x0) {
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    bVar1 = DefaultValue<TestColumnSizeHandler>::Exists();
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffb8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = DefaultValue<TestColumnSizeHandler>::Get();
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  else {
    OnCallSpec<TestColumnSizeHandler_()>::GetAction(in_RDX);
    local_4 = Action<TestColumnSizeHandler_()>::Perform(in_RSI,(ArgumentTuple *)in_RDX);
  }
  return local_4;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }